

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocumentContext.cpp
# Opt level: O0

ObjectReference __thiscall
PDFHummus::DocumentContext::GetReferenceFromState(DocumentContext *this,PDFDictionary *inDictionary)

{
  PDFObject *pPVar1;
  PDFInteger *pPVar2;
  ObjectIDType inObjectID;
  unsigned_long inGenerationNumber;
  allocator<char> local_a1;
  string local_a0;
  undefined1 local_80 [8];
  PDFObjectCastPtr<PDFInteger> generationNumber;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  PDFObjectCastPtr<PDFInteger> objectID;
  PDFDictionary *inDictionary_local;
  DocumentContext *this_local;
  
  objectID.super_RefCountPtr<PDFInteger>.mValue = (PDFInteger *)inDictionary;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"ObjectID",&local_59);
  pPVar1 = PDFDictionary::QueryDirectObject(inDictionary,&local_58);
  PDFObjectCastPtr<PDFInteger>::PDFObjectCastPtr((PDFObjectCastPtr<PDFInteger> *)local_38,pPVar1);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  pPVar2 = objectID.super_RefCountPtr<PDFInteger>.mValue;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"GenerationNumber",&local_a1);
  pPVar1 = PDFDictionary::QueryDirectObject((PDFDictionary *)pPVar2,&local_a0);
  PDFObjectCastPtr<PDFInteger>::PDFObjectCastPtr((PDFObjectCastPtr<PDFInteger> *)local_80,pPVar1);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  pPVar2 = RefCountPtr<PDFInteger>::operator->((RefCountPtr<PDFInteger> *)local_38);
  inObjectID = PDFInteger::GetValue(pPVar2);
  pPVar2 = RefCountPtr<PDFInteger>::operator->((RefCountPtr<PDFInteger> *)local_80);
  inGenerationNumber = PDFInteger::GetValue(pPVar2);
  ObjectReference::ObjectReference((ObjectReference *)&this_local,inObjectID,inGenerationNumber);
  PDFObjectCastPtr<PDFInteger>::~PDFObjectCastPtr((PDFObjectCastPtr<PDFInteger> *)local_80);
  PDFObjectCastPtr<PDFInteger>::~PDFObjectCastPtr((PDFObjectCastPtr<PDFInteger> *)local_38);
  return _this_local;
}

Assistant:

ObjectReference DocumentContext::GetReferenceFromState(PDFDictionary* inDictionary)
{
    PDFObjectCastPtr<PDFInteger> objectID(inDictionary->QueryDirectObject("ObjectID"));
    PDFObjectCastPtr<PDFInteger> generationNumber(inDictionary->QueryDirectObject("GenerationNumber"));

    return ObjectReference((ObjectIDType)(objectID->GetValue()),(unsigned long)generationNumber->GetValue());
}